

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  long lVar1;
  Inst *pIVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  Frag FVar7;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  uint uStack_3c;
  
  if (a.begin != 0) {
    uVar3 = AllocInst(this,2);
    if (-1 < (int)uVar3) {
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar3,n * 2,
                 a.begin);
      uVar6 = uVar3 + 1;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                 (ulong)uVar3 + 1,n * 2 + 1,0);
      uStack_3c = a.end.head;
      if (uStack_3c != 0) {
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        do {
          uVar5 = uStack_3c >> 1;
          if ((uStack_3c & 1) == 0) {
            uStack_3c = pIVar2[uVar5].out_opcode_ >> 4;
            pIVar2[uVar5].out_opcode_ = pIVar2[uVar5].out_opcode_ & 0xf | uVar6 * 0x10;
          }
          else {
            uStack_3c = pIVar2[uVar5].field_1.out1_;
            pIVar2[uVar5].field_1.out1_ = uVar6;
          }
        } while (uStack_3c != 0);
      }
      lVar1 = ((ulong)uVar6 << 0x21) + (ulong)uVar6 * 2;
      uStack_4c = (undefined4)lVar1;
      uStack_48 = (undefined4)((ulong)lVar1 >> 0x20);
      uStack_44 = CONCAT31(uStack_44._1_3_,a.nullable) & 0xffffff01;
      uVar4 = CONCAT44(uStack_4c,uVar3);
      goto LAB_011c408c;
    }
  }
  uVar4 = 0;
  uStack_48 = 0;
  uStack_44 = (uint)uStack_44._1_3_ << 8;
LAB_011c408c:
  FVar7._12_4_ = uStack_44;
  FVar7.end.tail = uStack_48;
  FVar7.begin = (int)uVar4;
  FVar7.end.head = (int)((ulong)uVar4 >> 0x20);
  return FVar7;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1), a.nullable);
}